

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall
FfsParser::parseCpdExtensionsArea(FfsParser *this,UModelIndex *index,UINT32 localOffset)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  TreeModel *pTVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  _Alloc_hider _Var9;
  _Alloc_hider _Var10;
  uint pos;
  USTATUS UVar11;
  char *pcVar12;
  pointer pcVar13;
  undefined4 in_register_00000014;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  uint uVar16;
  UByteArray data;
  UByteArray header;
  UByteArray local_3c8;
  _func_int **local_3a8;
  uint64_t uStack_3a0;
  TreeModel *local_398;
  UModelIndex *local_390;
  undefined8 local_388;
  CBString local_380;
  UModelIndex extIndex;
  uint local_350;
  UByteArray partition;
  CBString info;
  CBString name;
  UByteArray body;
  CBString local_258;
  CBString local_240;
  CBString local_228;
  CBString local_210;
  CBString local_1f8;
  CBString local_1e0;
  CBString local_1c8;
  CBString local_1b0;
  CBString local_198;
  CBString local_180;
  CBString local_168;
  CBString local_150;
  CBString local_138;
  CBString local_120;
  CBString local_108;
  CBString local_f0;
  CBString local_d8;
  CBString local_c0;
  CBString local_a8;
  CBString local_90;
  CBString local_78;
  CBString local_60;
  CBString local_48;
  
  local_388 = CONCAT44(in_register_00000014,localOffset);
  UVar11 = 1;
  if (((-1 < index->r) && (-1 < index->c)) && (index->m != (TreeModel *)0x0)) {
    TreeModel::body(&body,this->model,index);
    pos = 0;
    local_390 = index;
    do {
      _Var10._M_p = body.d._M_dataplus._M_p;
      paVar15 = &data.d.field_2;
      uVar16 = (uint)body.d._M_string_length - pos;
      if ((uint)body.d._M_string_length <= pos) break;
      iVar3 = *(int *)(body.d._M_dataplus._M_p + (ulong)pos + 4);
      if (iVar3 - 1U < uVar16) {
        UByteArray::mid(&partition,&body,pos,*(int32_t *)(body.d._M_dataplus._M_p + (ulong)pos + 4))
        ;
        cpdExtensionTypeToUstring(&name,*(UINT32 *)(_Var10._M_p + pos));
        usprintf(&info,"Full size: %Xh (%u)\nType: %Xh",(ulong)(uint)partition.d._M_string_length);
        _Var9 = partition.d._M_dataplus;
        extIndex.r = -1;
        extIndex.c = -1;
        extIndex.i = 0;
        extIndex.m = (TreeModel *)0x0;
        iVar4 = *(int *)(_Var10._M_p + pos);
        if (iVar4 == 10) {
          header.d._M_dataplus._M_p = (pointer)&header.d.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&header,partition.d._M_dataplus._M_p + 0x18,
                     partition.d._M_dataplus._M_p +
                     (long)(int)((uint)partition.d._M_string_length - 0x18) + 0x18);
          pcVar13 = header.d._M_dataplus._M_p + (header.d._M_string_length - 1);
          _Var8._M_p = header.d._M_dataplus._M_p;
          if (header.d._M_dataplus._M_p < pcVar13 && header.d._M_string_length != 0) {
            do {
              pcVar12 = _Var8._M_p + 1;
              cVar2 = *_Var8._M_p;
              *_Var8._M_p = *pcVar13;
              *pcVar13 = cVar2;
              pcVar13 = pcVar13 + -1;
              _Var8._M_p = pcVar12;
            } while (pcVar12 < pcVar13);
          }
          usprintf((CBString *)&local_3a8,
                   "Full size: %Xh (%u)\nType: %Xh\nCompression type: %Xh\nUncompressed size: %Xh (%u)\nCompressed size: %Xh (%u)\nGlobal module ID: %Xh\nImage hash: "
                   ,(ulong)(uint)partition.d._M_string_length,
                   (ulong)(uint)partition.d._M_string_length,(ulong)*(uint *)_Var9._M_p,
                   (ulong)*(uint *)(_Var9._M_p + 8),(ulong)*(uint *)(_Var9._M_p + 0xc),
                   (ulong)*(uint *)(_Var9._M_p + 0xc),(ulong)*(uint *)(_Var9._M_p + 0x10),
                   (ulong)*(uint *)(_Var9._M_p + 0x10),(ulong)*(uint *)(_Var9._M_p + 0x14));
          UByteArray::toHex(&data,&header);
          paVar15 = &data.d.field_2;
          Bstrlib::CBString::CBString(&local_380,data.d._M_dataplus._M_p);
          Bstrlib::CBString::operator+((CBString *)&local_3c8,(CBString *)&local_3a8,&local_380);
          Bstrlib::CBString::operator=(&info,(CBString *)&local_3c8);
          Bstrlib::CBString::~CBString((CBString *)&local_3c8);
          Bstrlib::CBString::~CBString(&local_380);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)data.d._M_dataplus._M_p != paVar15) {
            operator_delete(data.d._M_dataplus._M_p);
          }
          Bstrlib::CBString::~CBString((CBString *)&local_3a8);
          pTVar6 = this->model;
          Bstrlib::CBString::CBString(&local_380);
          data.d._M_string_length = 0;
          data.d.field_2._M_local_buf[0] = '\0';
          paVar1 = &local_3c8.d.field_2;
          local_3c8.d._M_string_length = 0;
          local_3c8.d.field_2._M_local_buf[0] = '\0';
          data.d._M_dataplus._M_p = (pointer)paVar15;
          local_3c8.d._M_dataplus._M_p = (pointer)paVar1;
          TreeModel::addItem((UModelIndex *)&local_3a8,pTVar6,pos + (int)local_388,'b','\0',&name,
                             &local_380,&info,&data,&partition,&local_3c8,Fixed,local_390,'\0');
          extIndex.m = local_398;
          extIndex._0_8_ = local_3a8;
          extIndex.i = uStack_3a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8.d._M_dataplus._M_p != paVar1) {
            operator_delete(local_3c8.d._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)data.d._M_dataplus._M_p != paVar15) {
            operator_delete(data.d._M_dataplus._M_p);
          }
          Bstrlib::CBString::~CBString(&local_380);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header.d._M_dataplus._M_p != &header.d.field_2) {
LAB_0013b0f9:
            operator_delete(header.d._M_dataplus._M_p);
          }
        }
        else if (iVar4 == 0x16) {
          uVar7 = *(ulong *)(partition.d._M_dataplus._M_p + 0x1c);
          uVar14 = uVar7 >> 0x28;
          if (0x30 < uVar14) {
            uVar14 = 0x30;
          }
          header.d._M_dataplus._M_p = (pointer)&header.d.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&header,partition.d._M_dataplus._M_p + 0x24,
                     partition.d._M_dataplus._M_p + uVar14 + 0x24);
          pcVar13 = header.d._M_dataplus._M_p + (header.d._M_string_length - 1);
          _Var8._M_p = header.d._M_dataplus._M_p;
          if (header.d._M_dataplus._M_p < pcVar13 && header.d._M_string_length != 0) {
            do {
              pcVar12 = _Var8._M_p + 1;
              cVar2 = *_Var8._M_p;
              *_Var8._M_p = *pcVar13;
              *pcVar13 = cVar2;
              pcVar13 = pcVar13 + -1;
              _Var8._M_p = pcVar12;
            } while (pcVar12 < pcVar13);
          }
          uVar14 = *(ulong *)(_Var9._M_p + 0x1c);
          usprintf(&local_258,
                   "Full size: %Xh (%u)\nType: %Xh\nPartition name: %.4s\nPartition length: %Xh\nPartition version major: %Xh\nPartition version minor: %Xh\nData format version: %Xh\nInstance ID: %Xh\nHash algorithm: %Xh\nHash size: %Xh\nAction on update: %Xh"
                   ,(ulong)(uint)partition.d._M_string_length,
                   (ulong)(uint)partition.d._M_string_length,(ulong)*(uint *)_Var9._M_p,
                   _Var9._M_p + 8,(ulong)*(uint *)(_Var9._M_p + 0xc),
                   (ulong)*(ushort *)(_Var9._M_p + 0x12),(ulong)*(ushort *)(_Var9._M_p + 0x10),
                   (ulong)*(uint *)(_Var9._M_p + 0x14),(ulong)*(uint *)(_Var9._M_p + 0x18),
                   uVar14 >> 0x20 & 0xff,uVar14 >> 0x28,(ulong)((uint)(uVar14 >> 2) & 3));
          Bstrlib::CBString::CBString(&local_120,"\nSupport multiple instances: ");
          Bstrlib::CBString::operator+(&local_108,&local_258,&local_120);
          pcVar12 = "Yes";
          if ((_Var9._M_p[0x1c] & 1U) == 0) {
            pcVar12 = "No";
          }
          Bstrlib::CBString::operator+(&local_240,&local_108,pcVar12);
          Bstrlib::CBString::CBString(&local_138,"\nSupport API version based update: ");
          Bstrlib::CBString::operator+(&local_f0,&local_240,&local_138);
          pcVar12 = "Yes";
          if ((_Var9._M_p[0x1c] & 2U) == 0) {
            pcVar12 = "No";
          }
          Bstrlib::CBString::operator+(&local_228,&local_f0,pcVar12);
          Bstrlib::CBString::CBString(&local_150,"\nObey full update rules: ");
          Bstrlib::CBString::operator+(&local_d8,&local_228,&local_150);
          pcVar12 = "Yes";
          if ((_Var9._M_p[0x1c] & 0x10U) == 0) {
            pcVar12 = "No";
          }
          Bstrlib::CBString::operator+(&local_210,&local_d8,pcVar12);
          Bstrlib::CBString::CBString(&local_168,"\nIFR enable only: ");
          Bstrlib::CBString::operator+(&local_c0,&local_210,&local_168);
          pcVar12 = "Yes";
          if ((_Var9._M_p[0x1c] & 0x20U) == 0) {
            pcVar12 = "No";
          }
          Bstrlib::CBString::operator+(&local_1f8,&local_c0,pcVar12);
          Bstrlib::CBString::CBString(&local_180,"\nAllow cross point update: ");
          Bstrlib::CBString::operator+(&local_a8,&local_1f8,&local_180);
          pcVar12 = "Yes";
          if ((_Var9._M_p[0x1c] & 0x40U) == 0) {
            pcVar12 = "No";
          }
          Bstrlib::CBString::operator+(&local_1e0,&local_a8,pcVar12);
          Bstrlib::CBString::CBString(&local_198,"\nAllow cross hotfix update: ");
          Bstrlib::CBString::operator+(&local_90,&local_1e0,&local_198);
          pcVar12 = "Yes";
          if (-1 < _Var9._M_p[0x1c]) {
            pcVar12 = "No";
          }
          Bstrlib::CBString::operator+(&local_1c8,&local_90,pcVar12);
          Bstrlib::CBString::CBString(&local_48,"\nPartial update only: ");
          Bstrlib::CBString::operator+(&local_78,&local_1c8,&local_48);
          pcVar12 = "Yes";
          if ((*(uint *)(_Var9._M_p + 0x1c) >> 8 & 1) == 0) {
            pcVar12 = "No";
          }
          Bstrlib::CBString::operator+(&local_380,&local_78,pcVar12);
          Bstrlib::CBString::CBString(&local_60,"\nPartition hash: ");
          Bstrlib::CBString::operator+((CBString *)&local_3a8,&local_380,&local_60);
          UByteArray::toHex(&data,&header);
          Bstrlib::CBString::CBString(&local_1b0,data.d._M_dataplus._M_p);
          Bstrlib::CBString::operator+((CBString *)&local_3c8,(CBString *)&local_3a8,&local_1b0);
          Bstrlib::CBString::operator=(&info,(CBString *)&local_3c8);
          Bstrlib::CBString::~CBString((CBString *)&local_3c8);
          Bstrlib::CBString::~CBString(&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)data.d._M_dataplus._M_p != &data.d.field_2) {
            operator_delete(data.d._M_dataplus._M_p);
          }
          Bstrlib::CBString::~CBString((CBString *)&local_3a8);
          Bstrlib::CBString::~CBString(&local_60);
          Bstrlib::CBString::~CBString(&local_380);
          Bstrlib::CBString::~CBString(&local_78);
          Bstrlib::CBString::~CBString(&local_48);
          Bstrlib::CBString::~CBString(&local_1c8);
          Bstrlib::CBString::~CBString(&local_90);
          Bstrlib::CBString::~CBString(&local_198);
          Bstrlib::CBString::~CBString(&local_1e0);
          Bstrlib::CBString::~CBString(&local_a8);
          Bstrlib::CBString::~CBString(&local_180);
          Bstrlib::CBString::~CBString(&local_1f8);
          Bstrlib::CBString::~CBString(&local_c0);
          Bstrlib::CBString::~CBString(&local_168);
          Bstrlib::CBString::~CBString(&local_210);
          Bstrlib::CBString::~CBString(&local_d8);
          Bstrlib::CBString::~CBString(&local_150);
          Bstrlib::CBString::~CBString(&local_228);
          Bstrlib::CBString::~CBString(&local_f0);
          Bstrlib::CBString::~CBString(&local_138);
          Bstrlib::CBString::~CBString(&local_240);
          Bstrlib::CBString::~CBString(&local_108);
          Bstrlib::CBString::~CBString(&local_120);
          Bstrlib::CBString::~CBString(&local_258);
          pTVar6 = this->model;
          Bstrlib::CBString::CBString(&local_380);
          data.d._M_dataplus._M_p = (pointer)&data.d.field_2;
          data.d._M_string_length = 0;
          data.d.field_2._M_local_buf[0] = '\0';
          paVar15 = &local_3c8.d.field_2;
          local_3c8.d._M_string_length = 0;
          local_3c8.d.field_2._M_local_buf[0] = '\0';
          local_3c8.d._M_dataplus._M_p = (pointer)paVar15;
          TreeModel::addItem((UModelIndex *)&local_3a8,pTVar6,pos + (int)local_388,'b','\0',&name,
                             &local_380,&info,&data,&partition,&local_3c8,Fixed,local_390,'\0');
          extIndex.m = local_398;
          extIndex._0_8_ = local_3a8;
          extIndex.i = uStack_3a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8.d._M_dataplus._M_p != paVar15) {
            operator_delete(local_3c8.d._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)data.d._M_dataplus._M_p != &data.d.field_2) {
            operator_delete(data.d._M_dataplus._M_p);
          }
          Bstrlib::CBString::~CBString(&local_380);
          local_350 = (uint)(uVar7 >> 0x28);
          if (0x30 < local_350) {
            usprintf((CBString *)&data,
                     "%s: IFWI Partition Manifest hash size is %u, maximum allowed is %u, truncated"
                     ,"parseCpdExtensionsArea",*(ulong *)(_Var9._M_p + 0x1c) >> 0x28,0x30);
            msg(this,(CBString *)&data,&extIndex);
            Bstrlib::CBString::~CBString((CBString *)&data);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header.d._M_dataplus._M_p != &header.d.field_2) {
            operator_delete(header.d._M_dataplus._M_p);
          }
        }
        else if (iVar4 == 0xf) {
          UByteArray::left(&header,&partition,0x34);
          UByteArray::mid(&data,&partition,(int32_t)header.d._M_string_length,-1);
          usprintf((CBString *)&local_3c8,
                   "Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nType: %Xh\nPackage name: %.4s\nVersion control number: %Xh\nSecurity version number: %Xh\nUsage bitmap: %02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X"
                   ,(ulong)(uint)partition.d._M_string_length,
                   (ulong)(uint)partition.d._M_string_length,header.d._M_string_length & 0xffffffff,
                   header.d._M_string_length & 0xffffffff,(ulong)(uint)body.d._M_string_length,
                   (ulong)(uint)body.d._M_string_length,(ulong)*(uint *)header.d._M_dataplus._M_p,
                   header.d._M_dataplus._M_p + 8,(ulong)*(uint *)(header.d._M_dataplus._M_p + 0xc),
                   (ulong)*(uint *)(header.d._M_dataplus._M_p + 0x20),
                   (ulong)(byte)header.d._M_dataplus._M_p[0x10],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x11],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x12],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x13],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x14],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x15],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x16],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x17],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x18],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x19],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x1a],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x1b],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x1c],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x1d],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x1e],
                   (ulong)(byte)header.d._M_dataplus._M_p[0x1f]);
          Bstrlib::CBString::operator=(&info,(CBString *)&local_3c8);
          Bstrlib::CBString::~CBString((CBString *)&local_3c8);
          pTVar6 = this->model;
          Bstrlib::CBString::CBString(&local_380);
          paVar15 = &local_3c8.d.field_2;
          local_3c8.d._M_string_length = 0;
          local_3c8.d.field_2._M_local_buf[0] = '\0';
          local_3c8.d._M_dataplus._M_p = (pointer)paVar15;
          TreeModel::addItem((UModelIndex *)&local_3a8,pTVar6,pos + (int)local_388,'b','\0',&name,
                             &local_380,&info,&header,&data,&local_3c8,Fixed,local_390,'\0');
          extIndex.m = local_398;
          extIndex._0_8_ = local_3a8;
          extIndex.i = uStack_3a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8.d._M_dataplus._M_p != paVar15) {
            operator_delete(local_3c8.d._M_dataplus._M_p);
          }
          Bstrlib::CBString::~CBString(&local_380);
          parseSignedPackageInfoData(this,&extIndex);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)data.d._M_dataplus._M_p != &data.d.field_2) {
            operator_delete(data.d._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header.d._M_dataplus._M_p != &header.d.field_2) goto LAB_0013b0f9;
        }
        else {
          pTVar6 = this->model;
          Bstrlib::CBString::CBString((CBString *)&local_3a8);
          header.d._M_dataplus._M_p = (pointer)&header.d.field_2;
          header.d._M_string_length = 0;
          header.d.field_2._M_local_buf[0] = '\0';
          data.d._M_string_length = 0;
          data.d.field_2._M_local_buf[0] = '\0';
          data.d._M_dataplus._M_p = (pointer)paVar15;
          TreeModel::addItem((UModelIndex *)&local_3c8,pTVar6,pos + (int)local_388,'b','\0',&name,
                             (CBString *)&local_3a8,&info,&header,&partition,&data,Fixed,local_390,
                             '\0');
          extIndex.m = (TreeModel *)
                       CONCAT71(local_3c8.d.field_2._M_allocated_capacity._1_7_,
                                local_3c8.d.field_2._M_local_buf[0]);
          extIndex._0_8_ = local_3c8.d._M_dataplus._M_p;
          extIndex.i = local_3c8.d._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)data.d._M_dataplus._M_p != paVar15) {
            operator_delete(data.d._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)header.d._M_dataplus._M_p != &header.d.field_2) {
            operator_delete(header.d._M_dataplus._M_p);
          }
          Bstrlib::CBString::~CBString((CBString *)&local_3a8);
        }
        uVar5 = *(uint *)(_Var10._M_p + pos);
        if ((0x1a < uVar5) &&
           ((0x32 < uVar5 || ((0x4000cc0000000U >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) {
          usprintf((CBString *)&header,"%s: CPD extension of unknown type found",
                   "parseCpdExtensionsArea");
          msg(this,(CBString *)&header,&extIndex);
          Bstrlib::CBString::~CBString((CBString *)&header);
        }
        pos = pos + *(int *)(_Var10._M_p + (ulong)pos + 4);
        Bstrlib::CBString::~CBString(&info);
        Bstrlib::CBString::~CBString(&name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)partition.d._M_dataplus._M_p != &partition.d.field_2) {
          operator_delete(partition.d._M_dataplus._M_p);
        }
      }
    } while (iVar3 - 1U < uVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)body.d._M_dataplus._M_p != &body.d.field_2) {
      operator_delete(body.d._M_dataplus._M_p);
    }
    UVar11 = 0;
  }
  return UVar11;
}

Assistant:

USTATUS FfsParser::parseCpdExtensionsArea(const UModelIndex & index, const UINT32 localOffset)
{
    if (!index.isValid()) {
        return U_INVALID_PARAMETER;
    }
    
    UByteArray body = model->body(index);
    UINT32 offset = 0;
    while (offset < (UINT32)body.size()) {
        const CPD_EXTENTION_HEADER* extHeader = (const CPD_EXTENTION_HEADER*) (body.constData() + offset);
        if (extHeader->Length > 0
            && extHeader->Length <= ((UINT32)body.size() - offset)) {
            UByteArray partition = body.mid(offset, extHeader->Length);
            
            UString name = cpdExtensionTypeToUstring(extHeader->Type);
            UString info = usprintf("Full size: %Xh (%u)\nType: %Xh", (UINT32)partition.size(), (UINT32)partition.size(), extHeader->Type);
            
            // Parse Signed Package Info a bit further
            UModelIndex extIndex;
            if (extHeader->Type == CPD_EXT_TYPE_SIGNED_PACKAGE_INFO) {
                UByteArray header = partition.left(sizeof(CPD_EXT_SIGNED_PACKAGE_INFO));
                UByteArray data = partition.mid(header.size());
                
                const CPD_EXT_SIGNED_PACKAGE_INFO* infoHeader = (const CPD_EXT_SIGNED_PACKAGE_INFO*)header.constData();
                
                info = usprintf("Full size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nType: %Xh\n"
                                "Package name: %.4s\nVersion control number: %Xh\nSecurity version number: %Xh\n"
                                "Usage bitmap: %02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X%02X",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                (UINT32)header.size(), (UINT32)header.size(),
                                (UINT32)body.size(), (UINT32)body.size(),
                                infoHeader->ExtensionType,
                                infoHeader->PackageName,
                                infoHeader->Vcn,
                                infoHeader->Svn,
                                infoHeader->UsageBitmap[0],  infoHeader->UsageBitmap[1],  infoHeader->UsageBitmap[2],  infoHeader->UsageBitmap[3],
                                infoHeader->UsageBitmap[4],  infoHeader->UsageBitmap[5],  infoHeader->UsageBitmap[6],  infoHeader->UsageBitmap[7],
                                infoHeader->UsageBitmap[8],  infoHeader->UsageBitmap[9],  infoHeader->UsageBitmap[10], infoHeader->UsageBitmap[11],
                                infoHeader->UsageBitmap[12], infoHeader->UsageBitmap[13], infoHeader->UsageBitmap[14], infoHeader->UsageBitmap[15]);
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, header, data, UByteArray(), Fixed, index);
                parseSignedPackageInfoData(extIndex);
            }
            // Parse IFWI Partition Manifest a bit further
            else if (extHeader->Type == CPD_EXT_TYPE_IFWI_PARTITION_MANIFEST) {
                const CPD_EXT_IFWI_PARTITION_MANIFEST* attrHeader = (const CPD_EXT_IFWI_PARTITION_MANIFEST*)partition.constData();
                
                // Check HashSize to be sane.
                UINT32 hashSize = attrHeader->HashSize;
                bool msgHashSizeMismatch = false;
                if (hashSize > sizeof(attrHeader->CompletePartitionHash)) {
                    hashSize = sizeof(attrHeader->CompletePartitionHash);
                    msgHashSizeMismatch = true;
                }
                
                // This hash is stored reversed
                // Need to reverse it back to normal
                UByteArray hash((const char*)&attrHeader->CompletePartitionHash, hashSize);
                std::reverse(hash.begin(), hash.end());
                
                info = usprintf("Full size: %Xh (%u)\nType: %Xh\n"
                                "Partition name: %.4s\nPartition length: %Xh\nPartition version major: %Xh\nPartition version minor: %Xh\n"
                                "Data format version: %Xh\nInstance ID: %Xh\nHash algorithm: %Xh\nHash size: %Xh\nAction on update: %Xh",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                attrHeader->ExtensionType,
                                attrHeader->PartitionName,
                                attrHeader->CompletePartitionLength,
                                attrHeader->PartitionVersionMajor, attrHeader->PartitionVersionMinor,
                                attrHeader->DataFormatVersion,
                                attrHeader->InstanceId,
                                attrHeader->HashAlgorithm,
                                attrHeader->HashSize,
                                attrHeader->ActionOnUpdate)
                + UString("\nSupport multiple instances: ") + (attrHeader->SupportMultipleInstances ? "Yes" : "No")
                + UString("\nSupport API version based update: ") + (attrHeader->SupportApiVersionBasedUpdate ? "Yes" : "No")
                + UString("\nObey full update rules: ") + (attrHeader->ObeyFullUpdateRules ? "Yes" : "No")
                + UString("\nIFR enable only: ") + (attrHeader->IfrEnableOnly ? "Yes" : "No")
                + UString("\nAllow cross point update: ") + (attrHeader->AllowCrossPointUpdate ? "Yes" : "No")
                + UString("\nAllow cross hotfix update: ") + (attrHeader->AllowCrossHotfixUpdate ? "Yes" : "No")
                + UString("\nPartial update only: ") + (attrHeader->PartialUpdateOnly ? "Yes" : "No")
                + UString("\nPartition hash: ") +  UString(hash.toHex().constData());
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
                if (msgHashSizeMismatch) {
                    msg(usprintf("%s: IFWI Partition Manifest hash size is %u, maximum allowed is %u, truncated", __FUNCTION__, attrHeader->HashSize, (UINT32)sizeof(attrHeader->CompletePartitionHash)), extIndex);
                }
            }
            // Parse Module Attributes a bit further
            else if (extHeader->Type == CPD_EXT_TYPE_MODULE_ATTRIBUTES) {
                const CPD_EXT_MODULE_ATTRIBUTES* attrHeader = (const CPD_EXT_MODULE_ATTRIBUTES*)partition.constData();
                int hashSize = (UINT32)partition.size() - CpdExtModuleImageHashOffset;
                
                // This hash is stored reversed
                // Need to reverse it back to normal
                UByteArray hash((const char*)attrHeader + CpdExtModuleImageHashOffset, hashSize);
                std::reverse(hash.begin(), hash.end());
                
                info = usprintf("Full size: %Xh (%u)\nType: %Xh\n"
                                "Compression type: %Xh\nUncompressed size: %Xh (%u)\nCompressed size: %Xh (%u)\nGlobal module ID: %Xh\nImage hash: ",
                                (UINT32)partition.size(), (UINT32)partition.size(),
                                attrHeader->ExtensionType,
                                attrHeader->CompressionType,
                                attrHeader->UncompressedSize, attrHeader->UncompressedSize,
                                attrHeader->CompressedSize, attrHeader->CompressedSize,
                                attrHeader->GlobalModuleId) + UString(hash.toHex().constData());
                
                // Add tree item
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
            }
            // Parse everything else
            else {
                // Add tree item, if needed
                extIndex = model->addItem(offset + localOffset, Types::CpdExtension, 0, name, UString(), info, UByteArray(), partition, UByteArray(), Fixed, index);
            }
            
            // There needs to be a more generic way to do it, but it is fine for now
            if (extHeader->Type > CPD_EXT_TYPE_TBT_METADATA
                && extHeader->Type != CPD_EXT_TYPE_GMF_CERTIFICATE
                && extHeader->Type != CPD_EXT_TYPE_GMF_BODY
                && extHeader->Type != CPD_EXT_TYPE_KEY_MANIFEST_EXT
                && extHeader->Type != CPD_EXT_TYPE_SIGNED_PACKAGE_INFO_EXT
                && extHeader->Type != CPD_EXT_TYPE_SPS_PLATFORM_ID) {
                msg(usprintf("%s: CPD extension of unknown type found", __FUNCTION__), extIndex);
            }
            
            offset += extHeader->Length;
        }
        else break;
        // TODO: add padding at the end
    }
    
    return U_SUCCESS;
}